

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O0

size_t __thiscall
capnp::_::PackedInputStream::tryRead
          (PackedInputStream *this,void *dst,size_t minBytes,size_t maxBytes)

{
  byte bVar1;
  BufferedInputStream *pBVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  uchar *puVar5;
  byte *pbVar6;
  ulong __n;
  uint8_t *puVar7;
  size_t __nbytes;
  uchar *extraout_RDX;
  byte *pbVar8;
  ArrayPtr<const_unsigned_char> AVar9;
  uchar *local_130;
  uchar *local_128;
  size_t inRemaining;
  Fault f_9;
  uint runLength_1;
  Fault f_8;
  Fault f_7;
  uint runLength;
  Fault f_6;
  bool isNonzero_7;
  bool isNonzero_6;
  bool isNonzero_5;
  bool isNonzero_4;
  bool isNonzero_3;
  bool isNonzero_2;
  bool isNonzero_1;
  bool isNonzero;
  Fault f_5;
  uchar *local_d0;
  Fault local_c8;
  Fault f_4;
  uchar *local_b8;
  uint local_ac;
  uint i;
  Fault f_3;
  uchar *local_98;
  Fault local_90;
  Fault f_2;
  byte *pbStack_80;
  uint8_t tag;
  uint8_t *in;
  ArrayPtr<const_unsigned_char> buffer;
  uint8_t *outMin;
  uint8_t *outEnd;
  uint8_t *out;
  Fault f_1;
  Fault local_38;
  Fault f;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *dst_local;
  PackedInputStream *this_local;
  
  if (maxBytes == 0) {
    this_local = (PackedInputStream *)0x0;
  }
  else {
    f.exception = (Exception *)maxBytes;
    if ((minBytes & 7) != 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
                (&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                 ,0x27,FAILED,"minBytes % sizeof(word) == 0",
                 "\"PackedInputStream reads must be word-aligned.\"",
                 (char (*) [46])"PackedInputStream reads must be word-aligned.");
      kj::_::Debug::Fault::fatal(&local_38);
    }
    if ((maxBytes & 7) != 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
                ((Fault *)&out,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                 ,0x28,FAILED,"maxBytes % sizeof(word) == 0",
                 "\"PackedInputStream reads must be word-aligned.\"",
                 (char (*) [46])"PackedInputStream reads must be word-aligned.");
      kj::_::Debug::Fault::fatal((Fault *)&out);
    }
    puVar7 = (uint8_t *)((long)dst + maxBytes);
    buffer.size_ = (long)dst + minBytes;
    iVar3 = (*(this->inner->super_InputStream)._vptr_InputStream[4])();
    in = (uint8_t *)CONCAT44(extraout_var,iVar3);
    buffer.ptr = extraout_RDX;
    sVar4 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&in);
    if (sVar4 == 0) {
      this_local = (PackedInputStream *)0x0;
    }
    else {
      pbStack_80 = kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&in);
      outEnd = (uint8_t *)dst;
LAB_0044265e:
      do {
        if (((long)outEnd - (long)dst & 7U) != 0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
                    (&local_90,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                     ,0x43,FAILED,"(out - reinterpret_cast<uint8_t*>(dst)) % sizeof(word) == 0",
                     "\"Output pointer should always be aligned here.\"",
                     (char (*) [46])"Output pointer should always be aligned here.");
          kj::_::Debug::Fault::fatal(&local_90);
        }
        puVar5 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
        if ((ulong)((long)puVar5 - (long)pbStack_80) < 10) {
          if (buffer.size_ <= outEnd) {
            pBVar2 = this->inner;
            puVar5 = kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&in);
            (*(pBVar2->super_InputStream)._vptr_InputStream[3])
                      (pBVar2,(long)pbStack_80 - (long)puVar5);
            return (size_t)(outEnd + -(long)dst);
          }
          pbVar6 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
          if (pbVar6 == pbStack_80) {
            pBVar2 = this->inner;
            kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&in);
            (*(pBVar2->super_InputStream)._vptr_InputStream[3])();
            _f_3 = kj::BufferedInputStream::getReadBuffer(this->inner);
            in = (uint8_t *)f_3.exception;
            buffer.ptr = local_98;
            sVar4 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&in);
            if (sVar4 == 0) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                        ((Fault *)&stack0xffffffffffffff58,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                         ,0x4d,FAILED,"buffer.size() > 0","\"Premature end of packed input.\"",
                         (char (*) [31])"Premature end of packed input.");
              kj::_::Debug::Fault::~Fault((Fault *)&stack0xffffffffffffff58);
              return (size_t)(outEnd + -(long)dst);
            }
            pbStack_80 = kj::ArrayPtr<const_unsigned_char>::begin
                                   ((ArrayPtr<const_unsigned_char> *)&in);
            goto LAB_0044265e;
          }
          f_2.exception._7_1_ = *pbStack_80;
          pbStack_80 = pbStack_80 + 1;
          for (local_ac = 0; local_ac < 8; local_ac = local_ac + 1) {
            if (((uint)f_2.exception._7_1_ & 1 << ((byte)local_ac & 0x1f)) == 0) {
              *outEnd = '\0';
            }
            else {
              pbVar6 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
              if (pbVar6 == pbStack_80) {
                pBVar2 = this->inner;
                kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&in);
                (*(pBVar2->super_InputStream)._vptr_InputStream[3])();
                _f_4 = kj::BufferedInputStream::getReadBuffer(this->inner);
                in = (uint8_t *)f_4.exception;
                buffer.ptr = local_b8;
                sVar4 = kj::ArrayPtr<const_unsigned_char>::size
                                  ((ArrayPtr<const_unsigned_char> *)&in);
                if (sVar4 == 0) {
                  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                            (&local_c8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                             ,0x59,FAILED,"buffer.size() > 0","\"Premature end of packed input.\"",
                             (char (*) [31])"Premature end of packed input.");
                  kj::_::Debug::Fault::~Fault(&local_c8);
                  return (size_t)(outEnd + -(long)dst);
                }
                pbStack_80 = kj::ArrayPtr<const_unsigned_char>::begin
                                       ((ArrayPtr<const_unsigned_char> *)&in);
              }
              *outEnd = *pbStack_80;
              pbStack_80 = pbStack_80 + 1;
            }
            outEnd = outEnd + 1;
          }
          pbVar6 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
          if ((pbVar6 == pbStack_80) &&
             ((f_2.exception._7_1_ == 0 || (f_2.exception._7_1_ == 0xff)))) {
            pBVar2 = this->inner;
            kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&in);
            (*(pBVar2->super_InputStream)._vptr_InputStream[3])();
            _f_5 = kj::BufferedInputStream::getReadBuffer(this->inner);
            in = (uint8_t *)f_5.exception;
            buffer.ptr = local_d0;
            sVar4 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&in);
            if (sVar4 == 0) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                        ((Fault *)&isNonzero_7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                         ,0x62,FAILED,"buffer.size() > 0","\"Premature end of packed input.\"",
                         (char (*) [31])"Premature end of packed input.");
              kj::_::Debug::Fault::~Fault((Fault *)&isNonzero_7);
              return (size_t)(outEnd + -(long)dst);
            }
            pbStack_80 = kj::ArrayPtr<const_unsigned_char>::begin
                                   ((ArrayPtr<const_unsigned_char> *)&in);
          }
        }
        else {
          pbVar6 = pbStack_80 + 1;
          f_2.exception._7_1_ = *pbStack_80;
          f_6.exception._7_1_ = (f_2.exception._7_1_ & 1) != 0;
          *outEnd = *pbVar6 & -f_6.exception._7_1_;
          pbVar6 = pbVar6 + (int)(uint)(byte)f_6.exception._7_1_;
          f_6.exception._6_1_ = (f_2.exception._7_1_ & 2) != 0;
          outEnd[1] = *pbVar6 & -f_6.exception._6_1_;
          pbVar6 = pbVar6 + (int)(uint)(byte)f_6.exception._6_1_;
          f_6.exception._5_1_ = (f_2.exception._7_1_ & 4) != 0;
          outEnd[2] = *pbVar6 & -f_6.exception._5_1_;
          pbVar6 = pbVar6 + (int)(uint)(byte)f_6.exception._5_1_;
          f_6.exception._4_1_ = (f_2.exception._7_1_ & 8) != 0;
          outEnd[3] = *pbVar6 & -f_6.exception._4_1_;
          pbVar6 = pbVar6 + (int)(uint)(byte)f_6.exception._4_1_;
          f_6.exception._3_1_ = (f_2.exception._7_1_ & 0x10) != 0;
          outEnd[4] = *pbVar6 & -f_6.exception._3_1_;
          pbVar6 = pbVar6 + (int)(uint)(byte)f_6.exception._3_1_;
          f_6.exception._2_1_ = (f_2.exception._7_1_ & 0x20) != 0;
          outEnd[5] = *pbVar6 & -f_6.exception._2_1_;
          pbVar6 = pbVar6 + (int)(uint)(byte)f_6.exception._2_1_;
          f_6.exception._1_1_ = (f_2.exception._7_1_ & 0x40) != 0;
          pbVar8 = outEnd + 7;
          outEnd[6] = *pbVar6 & -f_6.exception._1_1_;
          f_6.exception._0_1_ = (f_2.exception._7_1_ & 0x80) != 0;
          outEnd = outEnd + 8;
          *pbVar8 = pbVar6[(int)(uint)(byte)f_6.exception._1_1_] & -f_6.exception._0_1_;
          pbStack_80 = pbVar6 + (int)(uint)(byte)f_6.exception._1_1_ +
                       (int)(uint)(byte)f_6.exception._0_1_;
        }
        if (f_2.exception._7_1_ == 0) {
          pbVar6 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
          if (pbVar6 == pbStack_80) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42]>
                      ((Fault *)&stack0xffffffffffffff10,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                       ,0x7a,FAILED,"BUFFER_REMAINING > 0",
                       "\"Should always have non-empty buffer here.\"",
                       (char (*) [42])"Should always have non-empty buffer here.");
            kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff10);
          }
          bVar1 = *pbStack_80;
          if ((long)puVar7 - (long)outEnd < (long)((ulong)bVar1 << 3)) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[56]>
                      (&f_8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                       ,0x7f,FAILED,"runLength <= outEnd - out",
                       "\"Packed input did not end cleanly on a segment boundary.\"",
                       (char (*) [56])"Packed input did not end cleanly on a segment boundary.");
            kj::_::Debug::Fault::~Fault(&f_8);
            return (size_t)(outEnd + -(long)dst);
          }
          memset(outEnd,0,(ulong)bVar1 << 3);
          outEnd = outEnd + (ulong)bVar1 * 8;
          pbStack_80 = pbStack_80 + 1;
        }
        else if (f_2.exception._7_1_ == 0xff) {
          pbVar6 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
          if (pbVar6 == pbStack_80) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42]>
                      ((Fault *)&stack0xfffffffffffffef8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                       ,0x86,FAILED,"BUFFER_REMAINING > 0",
                       "\"Should always have non-empty buffer here.\"",
                       (char (*) [42])"Should always have non-empty buffer here.");
            kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffef8);
          }
          pbVar6 = pbStack_80 + 1;
          f_9.exception._4_4_ = (uint)*pbStack_80 << 3;
          if ((long)puVar7 - (long)outEnd < (long)((ulong)*pbStack_80 << 3)) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[56]>
                      ((Fault *)&inRemaining,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                       ,0x8b,FAILED,"runLength <= outEnd - out",
                       "\"Packed input did not end cleanly on a segment boundary.\"",
                       (char (*) [56])"Packed input did not end cleanly on a segment boundary.");
            kj::_::Debug::Fault::~Fault((Fault *)&inRemaining);
            return (size_t)(outEnd + -(long)dst);
          }
          puVar5 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
          __n = (long)puVar5 - (long)pbVar6;
          if (__n < f_9.exception._4_4_) {
            memcpy(outEnd,pbVar6,__n);
            __nbytes = f_9.exception._4_4_ - __n;
            f_9.exception._4_4_ = (uint)__nbytes;
            pBVar2 = this->inner;
            sVar4 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&in);
            (*(pBVar2->super_InputStream)._vptr_InputStream[3])(pBVar2,sVar4);
            kj::InputStream::read
                      (&this->inner->super_InputStream,(int)(outEnd + __n),
                       (void *)(ulong)f_9.exception._4_4_,__nbytes);
            outEnd = outEnd + __n + f_9.exception._4_4_;
            if (outEnd == puVar7) {
              return (size_t)f.exception;
            }
            AVar9 = kj::BufferedInputStream::getReadBuffer(this->inner);
            local_130 = AVar9.ptr;
            in = local_130;
            local_128 = (uchar *)AVar9.size_;
            buffer.ptr = local_128;
            pbStack_80 = kj::ArrayPtr<const_unsigned_char>::begin
                                   ((ArrayPtr<const_unsigned_char> *)&in);
            goto LAB_0044265e;
          }
          memcpy(outEnd,pbVar6,(ulong)f_9.exception._4_4_);
          outEnd = outEnd + f_9.exception._4_4_;
          pbStack_80 = pbVar6 + f_9.exception._4_4_;
        }
      } while (outEnd != puVar7);
      pBVar2 = this->inner;
      puVar5 = kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&in);
      (*(pBVar2->super_InputStream)._vptr_InputStream[3])(pBVar2,(long)pbStack_80 - (long)puVar5);
      this_local = (PackedInputStream *)f.exception;
    }
  }
  return (size_t)this_local;
}

Assistant:

size_t PackedInputStream::tryRead(void* dst, size_t minBytes, size_t maxBytes) {
  if (maxBytes == 0) {
    return 0;
  }

  KJ_DREQUIRE(minBytes % sizeof(word) == 0, "PackedInputStream reads must be word-aligned.");
  KJ_DREQUIRE(maxBytes % sizeof(word) == 0, "PackedInputStream reads must be word-aligned.");

  uint8_t* __restrict__ out = reinterpret_cast<uint8_t*>(dst);
  uint8_t* const outEnd = reinterpret_cast<uint8_t*>(dst) + maxBytes;
  uint8_t* const outMin = reinterpret_cast<uint8_t*>(dst) + minBytes;

  kj::ArrayPtr<const byte> buffer = inner.tryGetReadBuffer();
  if (buffer.size() == 0) {
    return 0;
  }
  const uint8_t* __restrict__ in = reinterpret_cast<const uint8_t*>(buffer.begin());

#define REFRESH_BUFFER() \
  inner.skip(buffer.size()); \
  buffer = inner.getReadBuffer(); \
  KJ_REQUIRE(buffer.size() > 0, "Premature end of packed input.") { \
    return out - reinterpret_cast<uint8_t*>(dst); \
  } \
  in = reinterpret_cast<const uint8_t*>(buffer.begin())

#define BUFFER_END (reinterpret_cast<const uint8_t*>(buffer.end()))
#define BUFFER_REMAINING ((size_t)(BUFFER_END - in))

  for (;;) {
    uint8_t tag;

    KJ_DASSERT((out - reinterpret_cast<uint8_t*>(dst)) % sizeof(word) == 0,
           "Output pointer should always be aligned here.");

    if (BUFFER_REMAINING < 10) {
      if (out >= outMin) {
        // We read at least the minimum amount, so go ahead and return.
        inner.skip(in - reinterpret_cast<const uint8_t*>(buffer.begin()));
        return out - reinterpret_cast<uint8_t*>(dst);
      }

      if (BUFFER_REMAINING == 0) {
        REFRESH_BUFFER();
        continue;
      }

      // We have at least 1, but not 10, bytes available.  We need to read slowly, doing a bounds
      // check on each byte.

      tag = *in++;

      for (uint i = 0; i < 8; i++) {
        if (tag & (1u << i)) {
          if (BUFFER_REMAINING == 0) {
            REFRESH_BUFFER();
          }
          *out++ = *in++;
        } else {
          *out++ = 0;
        }
      }

      if (BUFFER_REMAINING == 0 && (tag == 0 || tag == 0xffu)) {
        REFRESH_BUFFER();
      }
    } else {
      tag = *in++;

#define HANDLE_BYTE(n) \
      { \
         bool isNonzero = (tag & (1u << n)) != 0; \
         *out++ = *in & (-(int8_t)isNonzero); \
         in += isNonzero; \
      }

      HANDLE_BYTE(0);
      HANDLE_BYTE(1);
      HANDLE_BYTE(2);
      HANDLE_BYTE(3);
      HANDLE_BYTE(4);
      HANDLE_BYTE(5);
      HANDLE_BYTE(6);
      HANDLE_BYTE(7);
#undef HANDLE_BYTE
    }

    if (tag == 0) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= outEnd - out,
                 "Packed input did not end cleanly on a segment boundary.") {
        return out - reinterpret_cast<uint8_t*>(dst);
      }
      memset(out, 0, runLength);
      out += runLength;

    } else if (tag == 0xffu) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= outEnd - out,
                 "Packed input did not end cleanly on a segment boundary.") {
        return out - reinterpret_cast<uint8_t*>(dst);
      }

      size_t inRemaining = BUFFER_REMAINING;
      if (inRemaining >= runLength) {
        // Fast path.
        memcpy(out, in, runLength);
        out += runLength;
        in += runLength;
      } else {
        // Copy over the first buffer, then do one big read for the rest.
        memcpy(out, in, inRemaining);
        out += inRemaining;
        runLength -= inRemaining;

        inner.skip(buffer.size());
        inner.read(out, runLength);
        out += runLength;

        if (out == outEnd) {
          return maxBytes;
        } else {
          buffer = inner.getReadBuffer();
          in = reinterpret_cast<const uint8_t*>(buffer.begin());

          // Skip the bounds check below since we just did the same check above.
          continue;
        }
      }
    }

    if (out == outEnd) {
      inner.skip(in - reinterpret_cast<const uint8_t*>(buffer.begin()));
      return maxBytes;
    }
  }

  KJ_FAIL_ASSERT("Can't get here.");
  return 0;  // GCC knows KJ_FAIL_ASSERT doesn't return, but Eclipse CDT still warns...

#undef REFRESH_BUFFER
}